

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::Function<int_(int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestType_&,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++:68:27),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++:68:27)>_>_>
::dispose(Own<kj::Function<int_(int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestType_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27)>_>_>
          *this)

{
  Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestType_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27)>_>
  *object;
  Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestType_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27)>_>
  *ptrCopy;
  Own<kj::Function<int_(int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestType_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27)>_>_>
  *this_local;
  
  object = this->ptr;
  if (object != (Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestType_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27)>_>
                 *)0x0) {
    this->ptr = (Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestType_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:68:27)>_>
                 *)0x0;
    Disposer::
    dispose<kj::Function<int(int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestType&,kj::(anonymous_namespace)::TestCase57::run()::__4,kj::(anonymous_namespace)::TestCase57::run()::__5>>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }